

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O2

void __thiscall inja::Renderer::visit(Renderer *this,BlockStatementNode *node)

{
  pointer *pppBVar1;
  size_t sVar2;
  pointer ppTVar3;
  Template *pTVar4;
  const_iterator cVar5;
  BlockStatementNode *local_28;
  
  sVar2 = this->current_level;
  ppTVar3 = (this->template_stack).
            super__Vector_base<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this->current_level = 0;
  pTVar4 = *ppTVar3;
  this->current_template = pTVar4;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
          ::find(&(pTVar4->block_storage)._M_t,&node->name);
  if ((_Rb_tree_header *)cVar5._M_node !=
      &(this->current_template->block_storage)._M_t._M_impl.super__Rb_tree_header) {
    local_28 = node;
    ::std::vector<inja::BlockStatementNode_const*,std::allocator<inja::BlockStatementNode_const*>>::
    emplace_back<inja::BlockStatementNode_const*>
              ((vector<inja::BlockStatementNode_const*,std::allocator<inja::BlockStatementNode_const*>>
                *)&this->block_statement_stack,&local_28);
    (*(this->super_NodeVisitor)._vptr_NodeVisitor[2])(this,*(long *)(cVar5._M_node + 2) + 0x30);
    pppBVar1 = &(this->block_statement_stack).
                super__Vector_base<const_inja::BlockStatementNode_*,_std::allocator<const_inja::BlockStatementNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + -1;
  }
  this->current_level = sVar2;
  this->current_template =
       (this->template_stack).
       super__Vector_base<const_inja::Template_*,_std::allocator<const_inja::Template_*>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  return;
}

Assistant:

void visit(const BlockStatementNode& node) {
    const size_t old_level = current_level;
    current_level = 0;
    current_template = template_stack.front();
    const auto block_it = current_template->block_storage.find(node.name);
    if (block_it != current_template->block_storage.end()) {
      block_statement_stack.emplace_back(&node);
      block_it->second->block.accept(*this);
      block_statement_stack.pop_back();
    }
    current_level = old_level;
    current_template = template_stack.back();
  }